

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

string * common_sampler_type_to_str_abi_cxx11_
                   (string *__return_storage_ptr__,common_sampler_type cnstr)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(cnstr) {
  case COMMON_SAMPLER_TYPE_DRY:
    __s = "dry";
    __a = &local_9;
    break;
  case COMMON_SAMPLER_TYPE_TOP_K:
    __s = "top_k";
    __a = &local_a;
    break;
  case COMMON_SAMPLER_TYPE_TOP_P:
    __s = "top_p";
    __a = &local_c;
    break;
  case COMMON_SAMPLER_TYPE_MIN_P:
    __s = "min_p";
    __a = &local_d;
    break;
  default:
    __s = "";
    __a = &local_12;
    break;
  case COMMON_SAMPLER_TYPE_TYPICAL_P:
    __s = "typ_p";
    __a = &local_b;
    break;
  case COMMON_SAMPLER_TYPE_TEMPERATURE:
    __s = "temperature";
    __a = &local_e;
    break;
  case COMMON_SAMPLER_TYPE_XTC:
    __s = "xtc";
    __a = &local_f;
    break;
  case COMMON_SAMPLER_TYPE_INFILL:
    __s = "infill";
    __a = &local_10;
    break;
  case COMMON_SAMPLER_TYPE_PENALTIES:
    __s = "penalties";
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string common_sampler_type_to_str(enum common_sampler_type cnstr) {
    switch (cnstr) {
        case COMMON_SAMPLER_TYPE_DRY:         return "dry";
        case COMMON_SAMPLER_TYPE_TOP_K:       return "top_k";
        case COMMON_SAMPLER_TYPE_TYPICAL_P:   return "typ_p";
        case COMMON_SAMPLER_TYPE_TOP_P:       return "top_p";
        case COMMON_SAMPLER_TYPE_MIN_P:       return "min_p";
        case COMMON_SAMPLER_TYPE_TEMPERATURE: return "temperature";
        case COMMON_SAMPLER_TYPE_XTC:         return "xtc";
        case COMMON_SAMPLER_TYPE_INFILL:      return "infill";
        case COMMON_SAMPLER_TYPE_PENALTIES:   return "penalties";
        default : return "";
    }
}